

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,double timeout,Encoding encoding)

{
  bool bVar1;
  int iVar2;
  cmsysProcess *cp;
  char *pcVar3;
  ostream *poVar4;
  long lVar5;
  size_t length_00;
  pointer pbVar6;
  bool bVar7;
  cmProcessOutput processOutput;
  int length;
  char *data;
  string strdata;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pbVar6 = (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar6 != (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    strdata._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&strdata);
  }
  strdata._M_dataplus._M_p = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&strdata);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  if (outputflag == OUTPUT_MERGE) {
LAB_002ed04e:
    cmsysProcess_SetOption(cp,2,1);
LAB_002ed05f:
    bVar1 = false;
    captureStdErr = (string *)0x0;
  }
  else {
    if (outputflag == OUTPUT_PASSTHROUGH) {
      cmsysProcess_SetPipeShared(cp,2,1);
      cmsysProcess_SetPipeShared(cp,3,1);
      captureStdOut = (string *)0x0;
      goto LAB_002ed05f;
    }
    if (captureStdErr == (string *)0x0) goto LAB_002ed05f;
    bVar1 = true;
    if (captureStdErr == captureStdOut) goto LAB_002ed04e;
  }
  cmsysProcess_SetTimeout(cp,timeout);
  cmsysProcess_Execute(cp);
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  if ((outputflag != OUTPUT_PASSTHROUGH) &&
     (!(bool)(outputflag == OUTPUT_NONE & ~bVar1 & captureStdOut == (string *)0x0))) {
    while (iVar2 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), 0 < iVar2) {
      for (lVar5 = 0; length_00 = (size_t)length, lVar5 < (long)length_00; lVar5 = lVar5 + 1) {
        if (data[lVar5] == '\0') {
          data[lVar5] = ' ';
        }
      }
      if (iVar2 == 2) {
        if (outputflag != OUTPUT_NONE) {
          cmProcessOutput::DecodeText(&processOutput,data,length_00,&strdata,1);
          Stdout(strdata._M_dataplus._M_p,strdata._M_string_length);
        }
        if (captureStdOut != (string *)0x0) {
          std::vector<char,std::allocator<char>>::insert<char*,void>
                    ((vector<char,std::allocator<char>> *)&tempStdOut,
                     (const_iterator)
                     tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,data,data + length);
        }
      }
      else if (iVar2 == 3) {
        if (outputflag != OUTPUT_NONE) {
          cmProcessOutput::DecodeText(&processOutput,data,length_00,&strdata,2);
          Stderr(strdata._M_dataplus._M_p,strdata._M_string_length);
        }
        if (bVar1) {
          std::vector<char,std::allocator<char>>::insert<char*,void>
                    ((vector<char,std::allocator<char>> *)&tempStdErr,
                     (const_iterator)
                     tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,data,data + length);
        }
      }
    }
    if (outputflag != OUTPUT_NONE) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,1);
      std::__cxx11::string::~string((string *)&local_50);
      if (strdata._M_string_length != 0) {
        Stdout(strdata._M_dataplus._M_p,strdata._M_string_length);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      cmProcessOutput::DecodeText(&processOutput,&local_70,&strdata,2);
      std::__cxx11::string::~string((string *)&local_70);
      if (strdata._M_string_length != 0) {
        Stderr(strdata._M_dataplus._M_p,strdata._M_string_length);
      }
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (captureStdOut != (string *)0x0) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)captureStdOut,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&local_90,(string *)captureStdOut);
    cmProcessOutput::DecodeText(&processOutput,&local_90,captureStdOut,0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (bVar1) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)captureStdErr,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&local_b0,(string *)captureStdErr);
    cmProcessOutput::DecodeText(&processOutput,&local_b0,captureStdErr,0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  iVar2 = cmsysProcess_GetState(cp);
  if (iVar2 == 4) {
    if (retVal == (int *)0x0) {
      iVar2 = cmsysProcess_GetExitValue(cp);
      bVar7 = iVar2 == 0;
    }
    else {
      iVar2 = cmsysProcess_GetExitValue(cp);
      *retVal = iVar2;
      bVar7 = true;
    }
  }
  else {
    iVar2 = cmsysProcess_GetState(cp);
    if (iVar2 == 2) {
      pcVar3 = cmsysProcess_GetExceptionString(cp);
      if (outputflag != OUTPUT_NONE) {
        poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      if (bVar1) {
        strlen(pcVar3);
        std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar3);
      }
    }
    else {
      iVar2 = cmsysProcess_GetState(cp);
      if (iVar2 == 1) {
        pcVar3 = cmsysProcess_GetErrorString(cp);
        if (outputflag != OUTPUT_NONE) {
          poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        if (bVar1) {
          strlen(pcVar3);
          std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar3);
        }
      }
      else {
        iVar2 = cmsysProcess_GetState(cp);
        bVar7 = true;
        if (iVar2 != 5) goto LAB_002ed46a;
        if (outputflag != OUTPUT_NONE) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Process terminated due to timeout\n");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        if (bVar1) {
          std::__cxx11::string::append((char *)captureStdErr,0x511a55);
        }
      }
    }
    bVar7 = false;
  }
LAB_002ed46a:
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&strdata);
  cmProcessOutput::~cmProcessOutput(&processOutput);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempStdErr.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempStdOut.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return bVar7;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     double timeout, Encoding encoding)
{
  std::vector<const char*> argv;
  for (std::vector<std::string>::const_iterator a = command.begin();
       a != command.end(); ++a) {
    argv.push_back(a->c_str());
  }
  argv.push_back(CM_NULLPTR);

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    captureStdOut = CM_NULLPTR;
    captureStdErr = CM_NULLPTR;
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    captureStdErr = CM_NULLPTR;
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    while ((pipe = cmsysProcess_WaitForData(cp, &data, &length, CM_NULLPTR)) >
           0) {
      // Translate NULL characters in the output into valid text.
      for (int i = 0; i < length; ++i) {
        if (data[i] == '\0') {
          data[i] = ' ';
        }
      }

      if (pipe == cmsysProcess_Pipe_STDOUT) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 1);
          cmSystemTools::Stdout(strdata.c_str(), strdata.size());
        }
        if (captureStdOut) {
          tempStdOut.insert(tempStdOut.end(), data, data + length);
        }
      } else if (pipe == cmsysProcess_Pipe_STDERR) {
        if (outputflag != OUTPUT_NONE) {
          processOutput.DecodeText(data, length, strdata, 2);
          cmSystemTools::Stderr(strdata.c_str(), strdata.size());
        }
        if (captureStdErr) {
          tempStdErr.insert(tempStdErr.end(), data, data + length);
        }
      }
    }

    if (outputflag != OUTPUT_NONE) {
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        cmSystemTools::Stdout(strdata.c_str(), strdata.size());
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        cmSystemTools::Stderr(strdata.c_str(), strdata.size());
      }
    }
  }

  cmsysProcess_WaitForExit(cp, CM_NULLPTR);

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << exception_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(exception_str, strlen(exception_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}